

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

int check_plan(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int local_28;
  undefined4 uStack_24;
  int local_1c;
  
  lVar2 = (long)level;
  iVar3 = 0;
  iVar1 = level;
  if (tests_done[lVar2] != plan_test[lVar2]) {
    check_plan_cold_1();
    lVar2 = CONCAT44(uStack_24,local_28);
    iVar3 = -1;
    iVar1 = local_1c;
  }
  if (tests_failed[lVar2] != 0) {
    check_plan_cold_2();
    iVar1 = local_1c;
    iVar3 = local_28;
  }
  level = iVar1 + -1;
  if (0 < iVar1) {
    _ok((uint)(iVar3 == 0),"r == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/unit.c",0x39,
        "subtests");
  }
  return iVar3;
}

Assistant:

int
check_plan(void)
{
	int r = 0;
	if (tests_done[level] != plan_test[level]) {
		_space(stderr);
		fprintf(stderr,
			"# Looks like you planned %d tests but ran %d.\n",
			plan_test[level], tests_done[level]);
		r = -1;
	}

	if (tests_failed[level]) {
		_space(stderr);
		fprintf(stderr,
			"# Looks like you failed %d test of %d run.\n",
			tests_failed[level], tests_done[level]);
		r = tests_failed[level];
	}
	--level;
	if (level >= 0) {
		is(r, 0, "subtests");
	}
	return r;
}